

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::DragLineX(char *id,double *value,bool show_label,ImVec4 *col,float thickness)

{
  float _y;
  float _y_00;
  ImPlotContext *pIVar1;
  ImDrawList *pIVar2;
  ImU32 bg;
  bool bVar3;
  ImU32 fg;
  ImGuiWindow *pIVar4;
  float _x;
  float _x_00;
  ImVec2 IVar5;
  double dVar6;
  ImPlotPoint IVar7;
  ImVec4 *local_120;
  bool local_112;
  double local_110;
  bool dragging;
  ImVec2 local_f0;
  char local_e8 [8];
  char buff [32];
  ImVec2 local_c0;
  ImVec2 new_cursor_pos;
  ImVec2 old_cursor_pos;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImDrawList *local_80;
  ImDrawList *DrawList;
  undefined1 auStack_70 [4];
  ImU32 col32;
  ImVec4 color;
  float len;
  bool outside;
  float x;
  float yb;
  float yt;
  float grab_size;
  ImPlotContext *gp;
  float thickness_local;
  ImVec4 *col_local;
  bool show_label_local;
  double *value_local;
  char *id_local;
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    _x = ImMax<float>(5.0,thickness);
    _y = (pIVar1->CurrentPlot->PlotRect).Min.y;
    _y_00 = (pIVar1->CurrentPlot->PlotRect).Max.y;
    IVar5 = PlotToPixels(*value,0.0,-1);
    len = IVar5.x;
    _x_00 = (float)(int)(len + 0.5);
    local_112 = true;
    if ((pIVar1->CurrentPlot->PlotRect).Min.x - _x / 2.0 <= _x_00) {
      local_112 = (pIVar1->CurrentPlot->PlotRect).Max.x + _x / 2.0 < _x_00;
    }
    color.w._3_1_ = local_112;
    if (local_112 == false) {
      color.z = (pIVar1->Style).MajorTickLen.x;
      bVar3 = IsColorAuto(col);
      local_120 = col;
      if (bVar3) {
        local_120 = ImGui::GetStyleColorVec4(0);
      }
      auStack_70 = local_120->x;
      unique0x00012004 = local_120->y;
      color.x = local_120->z;
      color.y = local_120->w;
      DrawList._4_4_ = ImGui::ColorConvertFloat4ToU32((ImVec4 *)auStack_70);
      local_80 = GetPlotDrawList();
      PushPlotClipRect(0.0);
      pIVar2 = local_80;
      ImVec2::ImVec2(&local_88,_x_00,_y);
      ImVec2::ImVec2(&local_90,_x_00,_y_00);
      ImDrawList::AddLine(pIVar2,&local_88,&local_90,DrawList._4_4_,thickness);
      pIVar2 = local_80;
      ImVec2::ImVec2(&local_98,_x_00,_y);
      ImVec2::ImVec2(&local_a0,_x_00,_y + color.z);
      ImDrawList::AddLine(pIVar2,&local_98,&local_a0,DrawList._4_4_,thickness * 3.0);
      pIVar2 = local_80;
      ImVec2::ImVec2(&local_a8,_x_00,_y_00);
      ImVec2::ImVec2(&old_cursor_pos,_x_00,_y_00 - color.z);
      ImDrawList::AddLine(pIVar2,&local_a8,&old_cursor_pos,DrawList._4_4_,thickness * 3.0);
      PopPlotClipRect();
      if (((pIVar1->CurrentPlot->Selecting & 1U) == 0) &&
         ((pIVar1->CurrentPlot->Querying & 1U) == 0)) {
        new_cursor_pos = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2(&local_c0,_x_00 - _x / 2.0,_y);
        pIVar4 = ImGui::GetCurrentWindow();
        (pIVar4->DC).CursorPos = local_c0;
        ImVec2::ImVec2((ImVec2 *)(buff + 0x18),_x,_y_00 - _y);
        ImGui::InvisibleButton(id,(ImVec2 *)(buff + 0x18),0);
        pIVar4 = ImGui::GetCurrentWindow();
        (pIVar4->DC).CursorPos = new_cursor_pos;
        bVar3 = ImGui::IsItemHovered(0);
        if ((bVar3) || (bVar3 = ImGui::IsItemActive(), bVar3)) {
          pIVar1->CurrentPlot->PlotHovered = false;
          ImGui::SetMouseCursor(4);
          if (show_label) {
            LabelAxisValue(&pIVar1->CurrentPlot->XAxis,&pIVar1->XTicks,*value,local_e8,0x20);
            ImVec2::ImVec2(&local_f0,_x_00,_y_00);
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff08,0.0,0.0);
            bg = DrawList._4_4_;
            fg = CalcTextColor((ImVec4 *)auStack_70);
            ImPlotAnnotationCollection::Append
                      (&pIVar1->Annotations,&local_f0,(ImVec2 *)&stack0xffffffffffffff08,bg,fg,true,
                       "%s = %s",id,local_e8);
          }
        }
        id_local._7_1_ = false;
        bVar3 = ImGui::IsItemActive();
        if ((bVar3) && (bVar3 = ImGui::IsMouseDragging(0,-1.0), bVar3)) {
          IVar7 = GetPlotMousePos(-1);
          local_110 = IVar7.x;
          *value = local_110;
          dVar6 = ImClamp<double>(*value,(pIVar1->CurrentPlot->XAxis).Range.Min,
                                  (pIVar1->CurrentPlot->XAxis).Range.Max);
          *value = dVar6;
          id_local._7_1_ = true;
        }
      }
      else {
        id_local._7_1_ = false;
      }
    }
    else {
      id_local._7_1_ = false;
    }
    return id_local._7_1_;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"DragLineX() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xb17,"bool ImPlot::DragLineX(const char *, double *, bool, const ImVec4 &, float)"
               );
}

Assistant:

bool DragLineX(const char* id, double* value, bool show_label, const ImVec4& col, float thickness) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "DragLineX() needs to be called between BeginPlot() and EndPlot()!");
    const float grab_size = ImMax(5.0f, thickness);
    float yt = gp.CurrentPlot->PlotRect.Min.y;
    float yb = gp.CurrentPlot->PlotRect.Max.y;
    float x  = IM_ROUND(PlotToPixels(*value,0).x);
    const bool outside = x < (gp.CurrentPlot->PlotRect.Min.x - grab_size / 2) || x > (gp.CurrentPlot->PlotRect.Max.x + grab_size / 2);
    if (outside)
        return false;
    float len = gp.Style.MajorTickLen.x;
    ImVec4 color = IsColorAuto(col) ? ImGui::GetStyleColorVec4(ImGuiCol_Text) : col;
    ImU32 col32 = ImGui::ColorConvertFloat4ToU32(color);
    ImDrawList& DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    DrawList.AddLine(ImVec2(x,yt), ImVec2(x,yb),     col32, thickness);
    DrawList.AddLine(ImVec2(x,yt), ImVec2(x,yt+len), col32, 3*thickness);
    DrawList.AddLine(ImVec2(x,yb), ImVec2(x,yb-len), col32, 3*thickness);
    PopPlotClipRect();
    if (gp.CurrentPlot->Selecting || gp.CurrentPlot->Querying)
        return false;
    ImVec2 old_cursor_pos = ImGui::GetCursorScreenPos();
    ImVec2 new_cursor_pos = ImVec2(x - grab_size / 2.0f, yt);
    ImGui::GetCurrentWindow()->DC.CursorPos = new_cursor_pos;
    ImGui::InvisibleButton(id, ImVec2(grab_size, yb-yt));
    ImGui::GetCurrentWindow()->DC.CursorPos = old_cursor_pos;
    if (ImGui::IsItemHovered() || ImGui::IsItemActive()) {
        gp.CurrentPlot->PlotHovered = false;
        ImGui::SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        if (show_label) {
            char buff[32];
            LabelAxisValue(gp.CurrentPlot->XAxis, gp.XTicks, *value, buff, 32);
            gp.Annotations.Append(ImVec2(x,yb),ImVec2(0,0),col32,CalcTextColor(color),true,"%s = %s", id, buff);
        }
    }
    bool dragging = false;
    if (ImGui::IsItemActive() && ImGui::IsMouseDragging(0)) {
        *value = ImPlot::GetPlotMousePos().x;
        *value = ImClamp(*value, gp.CurrentPlot->XAxis.Range.Min, gp.CurrentPlot->XAxis.Range.Max);
        dragging = true;
    }
    return dragging;
}